

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

Spins * __thiscall
openjij::graph::Graph::
gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Spins *__return_storage_ptr__,Graph *this,
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *random_numder_engine)

{
  int *piVar1;
  result_type_conflict rVar2;
  Spins *__range3;
  int *elem;
  int *piVar3;
  uniform_int_distribution<int> uid;
  allocator_type local_31;
  param_type local_30;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,this->_num_spins,&local_31);
  local_30._M_a = 0;
  local_30._M_b = 1;
  piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar1) {
    do {
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_30,random_numder_engine,&local_30);
      *piVar3 = rVar2 * 2 + -1;
      piVar3 = piVar3 + 1;
    } while (piVar3 != piVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

const Spins gen_spin(RandomNumberEngine &random_numder_engine) const {
    // generate spin array
    Spins ret_spin(_num_spins);

    std::uniform_int_distribution<> uid(0, 1);
    for (auto &elem : ret_spin) {
      elem = 2 * uid(random_numder_engine) - 1;
    }

    return ret_spin;
  }